

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::Parent::insertAfter(Parent *this,uint i,uint splitKey,uint child)

{
  uint child_local;
  uint splitKey_local;
  uint i_local;
  Parent *this_local;
  
  if (this->children[7] == 0) {
    amove<kj::_::BTreeImpl::MaybeUint>(this->keys + (ulong)i + 1,this->keys + i,7 - (ulong)(i + 1));
    MaybeUint::operator=(this->keys + i,splitKey);
    amove<unsigned_int>(this->children + (ulong)i + 2,this->children + (ulong)i + 1,
                        8 - (ulong)(i + 2));
    this->children[i + 1] = child;
    return;
  }
  inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
             ,0x2fa,"children[Parent::NCHILDREN - 1] == 0","",(char *)0x0);
}

Assistant:

void BTreeImpl::Parent::insertAfter(uint i, uint splitKey, uint child) {
  KJ_IREQUIRE(children[Parent::NCHILDREN - 1] == 0);  // check not full

  amove(keys + i + 1, keys + i, Parent::NKEYS - (i + 1));
  keys[i] = splitKey;

  amove(children + i + 2, children + i + 1, Parent::NCHILDREN - (i + 2));
  children[i + 1] = child;
}